

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O2

void __thiscall icu_63::ICUNumberFormatService::ICUNumberFormatService(ICUNumberFormatService *this)

{
  ICUNumberFormatFactory *this_00;
  UnicodeString *dname;
  ConstChar16Ptr local_70;
  char16_t *local_68;
  UErrorCode status;
  
  local_70.p_ = L"Number Format";
  icu_63::UnicodeString::UnicodeString((UnicodeString *)&status,'\x01',&local_70,-1);
  dname = (UnicodeString *)&status;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&status);
  local_68 = local_70.p_;
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__ICUNumberFormatService_00461cd0;
  status = U_ZERO_ERROR;
  this_00 = (ICUNumberFormatFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  if (this_00 != (ICUNumberFormatFactory *)0x0) {
    memset(this_00,0,0x90);
    ICUNumberFormatFactory::ICUNumberFormatFactory(this_00);
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,this_00,&status);
  return;
}

Assistant:

ICUNumberFormatService()
        : ICULocaleService(UNICODE_STRING_SIMPLE("Number Format"))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new ICUNumberFormatFactory(), status);
    }